

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaTruth.c
# Opt level: O2

Gia_Man_t * Gia_ManIsoNpnReduce(Gia_Man_t *p,Vec_Ptr_t **pvPosEquivs,int fVerbose)

{
  ulong uVar1;
  word *pwVar2;
  ulong *puVar3;
  ulong uVar4;
  ulong uVar5;
  word wVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  uint uVar10;
  Vec_Wec_t *p_00;
  Vec_Int_t *pVVar11;
  Vec_Mem_t *pVVar12;
  Vec_Int_t *pVVar13;
  Gia_Obj_t *pObj;
  word *pwVar14;
  word *pwVar15;
  int *piVar16;
  word **ppwVar17;
  Gia_Man_t *pGVar18;
  Vec_Ptr_t *pVVar19;
  void **__ptr;
  void *pvVar20;
  byte bVar21;
  uint uVar22;
  uint uVar23;
  int iVar24;
  uint *pTruthU;
  word *pwVar25;
  int iVar26;
  ulong uVar27;
  ulong uVar28;
  int i_1;
  ulong uVar29;
  ulong uVar30;
  word *pwVar31;
  ulong uVar32;
  int iVar33;
  size_t __size;
  ulong uVar34;
  int i;
  ulong uVar35;
  long lVar36;
  long lVar37;
  bool bVar38;
  int local_198;
  int local_194;
  int iObj;
  Vec_Ptr_t **local_160;
  char pCanonPerm [16];
  Vec_Int_t *vTt2Class [17];
  Vec_Mem_t *vTtMem [17];
  
  local_160 = pvPosEquivs;
  p_00 = (Vec_Wec_t *)malloc(0x10);
  p_00->nCap = 100;
  p_00->nSize = 0;
  pVVar11 = (Vec_Int_t *)calloc(100,0x10);
  p_00->pArray = pVVar11;
  pVVar11 = Vec_IntAlloc(0x10);
  iVar7 = Abc_PrimeCudd(1000);
  for (uVar35 = 0; uVar35 != 0x11; uVar35 = uVar35 + 1) {
    iVar33 = 1 << ((char)uVar35 - 6U & 0x1f);
    if (uVar35 < 7) {
      iVar33 = 1;
    }
    pVVar12 = (Vec_Mem_t *)calloc(1,0x30);
    pVVar12->nEntrySize = iVar33;
    pVVar12->LogPageSze = 10;
    pVVar12->PageMask = 0x3ff;
    pVVar12->iPage = -1;
    vTtMem[uVar35] = pVVar12;
    pVVar13 = Vec_IntStartFull(iVar7);
    pVVar12->vTable = pVVar13;
    pVVar13 = Vec_IntAlloc(1000);
    pVVar12->vNexts = pVVar13;
    pVVar13 = Vec_IntStartFull(p->vCos->nSize + 1);
    vTt2Class[uVar35] = pVVar13;
  }
  Gia_ObjComputeTruthTableStart(p,0x10);
  local_198 = -1;
  iVar7 = 0;
  local_194 = local_198;
  do {
    if ((p->vCos->nSize - p->nRegs <= iVar7) ||
       (pObj = Gia_ManCo(p,iVar7), pObj == (Gia_Obj_t *)0x0)) {
      Gia_ObjComputeTruthTableStop(p);
      Vec_IntFree(pVVar11);
      for (lVar36 = 0; lVar36 != 0x11; lVar36 = lVar36 + 1) {
        pVVar12 = vTtMem[lVar36];
        if (pVVar12 != (Vec_Mem_t *)0x0) {
          Vec_IntFreeP(&pVVar12->vTable);
          Vec_IntFreeP(&pVVar12->vNexts);
        }
        for (lVar37 = 0; lVar37 <= pVVar12->iPage; lVar37 = lVar37 + 1) {
          pwVar14 = pVVar12->ppPages[lVar37];
          if (pwVar14 != (word *)0x0) {
            free(pwVar14);
            pVVar12->ppPages[lVar37] = (word *)0x0;
          }
        }
        free(pVVar12->ppPages);
        free(pVVar12);
        Vec_IntFree(vTt2Class[lVar36]);
      }
      uVar22 = p_00->nSize;
      pVVar11 = Vec_IntAlloc(uVar22);
      uVar23 = 0;
      uVar9 = 0;
      if (0 < (int)uVar22) {
        uVar23 = uVar22;
        uVar9 = 0;
      }
      for (; uVar23 != uVar9; uVar9 = uVar9 + 1) {
        pVVar13 = Vec_WecEntry(p_00,uVar9);
        if (0 < pVVar13->nSize) {
          iVar7 = Vec_IntEntry(pVVar13,0);
          Vec_IntPush(pVVar11,iVar7);
        }
      }
      pGVar18 = Gia_ManDupCones(p,pVVar11->pArray,pVVar11->nSize,0);
      Vec_IntFree(pVVar11);
      if (fVerbose != 0) {
        puts("Nontrivial classes:");
        for (uVar9 = 0; uVar9 != uVar23; uVar9 = uVar9 + 1) {
          pVVar11 = Vec_WecEntry(p_00,uVar9);
          if (pVVar11->nSize != 1) {
            printf(" %4d : {",(ulong)uVar9);
            for (iVar7 = 0; iVar7 < pVVar11->nSize; iVar7 = iVar7 + 1) {
              uVar10 = Vec_IntEntry(pVVar11,iVar7);
              printf(" %d",(ulong)uVar10);
            }
            puts(" }");
          }
        }
      }
      if (local_160 != (Vec_Ptr_t **)0x0) {
        pVVar19 = (Vec_Ptr_t *)malloc(0x10);
        uVar23 = 8;
        if (6 < uVar22 - 1) {
          uVar23 = uVar22;
        }
        uVar35 = (ulong)uVar23;
        pVVar19->nSize = 0;
        pVVar19->nCap = uVar23;
        if (uVar23 == 0) {
          __ptr = (void **)0x0;
        }
        else {
          __ptr = (void **)malloc((long)(int)uVar23 << 3);
        }
        pVVar19->pArray = __ptr;
        uVar28 = 0;
        while ((int)uVar28 < (int)uVar22) {
          pVVar11 = Vec_WecEntry(p_00,(int)uVar28);
          piVar16 = (int *)malloc(0x10);
          iVar7 = pVVar11->nSize;
          piVar16[1] = iVar7;
          *piVar16 = iVar7;
          if ((long)iVar7 == 0) {
            __size = 0;
            pvVar20 = (void *)0x0;
          }
          else {
            __size = (long)iVar7 << 2;
            pvVar20 = malloc(__size);
          }
          *(void **)(piVar16 + 2) = pvVar20;
          memcpy(pvVar20,pVVar11->pArray,__size);
          iVar7 = (int)uVar35;
          if (uVar28 == uVar35) {
            uVar34 = (ulong)(uint)(iVar7 * 2);
            if (iVar7 < 0x10) {
              uVar34 = 0x10;
            }
            if (iVar7 < (int)uVar34) {
              if (__ptr == (void **)0x0) {
                __ptr = (void **)malloc(uVar34 << 3);
              }
              else {
                __ptr = (void **)realloc(__ptr,uVar34 << 3);
                uVar22 = p_00->nSize;
              }
              pVVar19->pArray = __ptr;
              pVVar19->nCap = (int)uVar34;
              uVar35 = uVar34;
            }
          }
          pVVar19->nSize = (int)(uVar28 + 1);
          __ptr[uVar28] = piVar16;
          uVar28 = uVar28 + 1;
        }
        *local_160 = pVVar19;
      }
      pVVar11 = p_00->pArray;
      uVar28 = 0;
      uVar35 = (ulong)(uint)p_00->nCap;
      if (p_00->nCap < 1) {
        uVar35 = uVar28;
      }
      for (; uVar35 * 0x10 != uVar28; uVar28 = uVar28 + 0x10) {
        pvVar20 = *(void **)((long)&pVVar11->pArray + uVar28);
        if (pvVar20 != (void *)0x0) {
          free(pvVar20);
          *(undefined8 *)((long)&pVVar11->pArray + uVar28) = 0;
        }
      }
      free(pVVar11);
      free(p_00);
      return pGVar18;
    }
    iObj = Gia_ObjId(p,pObj);
    Gia_ManCollectCis(p,&iObj,1,pVVar11);
    if (pVVar11->nSize < 0x11) {
      uVar35 = (ulong)((uint)*(undefined8 *)pObj & 0x1fffffff);
      if ((~*(ulong *)(pObj + -uVar35) & 0x1fffffff1fffffff) == 0) {
        iVar33 = local_194;
        if (local_194 == -1) {
          iVar33 = p_00->nSize;
          Vec_WecPushLevel(p_00);
          local_194 = iVar33;
        }
      }
      else {
        uVar22 = (uint)*(ulong *)(pObj + -uVar35);
        if ((~uVar22 & 0x9fffffff) != 0) {
          if (((int)uVar22 < 0) || ((uVar22 & 0x1fffffff) == 0x1fffffff)) {
            __assert_fail("Gia_ObjIsAnd(pObj)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                          ,0x2f7,"Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
          }
          pwVar14 = Gia_ObjComputeTruthTableCut(p,pObj + -uVar35,pVVar11);
          uVar22 = pVVar11->nSize;
          if (0x10 < (int)uVar22) {
            __assert_fail("nVarsAll <= 16",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                          ,0x6ec,"int Abc_TtMinimumBase(word *, int *, int, int *)");
          }
          uVar34 = (ulong)(uint)(1 << ((char)uVar22 - 6U & 0x1f));
          uVar28 = 0;
          uVar35 = 0;
          if (0 < (int)uVar22) {
            uVar35 = (ulong)uVar22;
          }
          uVar29 = 0;
          uVar23 = 0;
          for (; iVar33 = (int)uVar29, uVar28 != uVar35; uVar28 = uVar28 + 1) {
            bVar21 = (byte)uVar28;
            if ((int)uVar22 < 7) {
              iVar8 = Abc_Tt6HasVar(*pwVar14,(int)uVar28);
              bVar38 = iVar8 == 0;
            }
            else if (uVar28 < 6) {
              uVar29 = 0;
              do {
                bVar38 = uVar34 == uVar29;
                if (bVar38) break;
                puVar3 = pwVar14 + uVar29;
                uVar29 = uVar29 + 1;
              } while ((s_Truths6Neg[uVar28] &
                       (*puVar3 >> ((byte)(1 << (bVar21 & 0x1f)) & 0x3f) ^ *puVar3)) == 0);
            }
            else {
              uVar29 = (ulong)(uint)(1 << (bVar21 - 6 & 0x1f));
              uVar9 = 2 << (bVar21 - 6 & 0x1f);
              pwVar25 = pwVar14 + uVar29;
              for (pwVar15 = pwVar14; pwVar15 < pwVar14 + uVar34; pwVar15 = pwVar15 + uVar9) {
                uVar30 = 0;
                while (uVar29 != uVar30) {
                  pwVar31 = pwVar15 + uVar30;
                  pwVar2 = pwVar25 + uVar30;
                  uVar30 = uVar30 + 1;
                  if (*pwVar31 != *pwVar2) {
                    bVar38 = false;
                    goto LAB_00210979;
                  }
                }
                pwVar25 = pwVar25 + uVar9;
              }
              bVar38 = true;
            }
LAB_00210979:
            uVar9 = 1 << (bVar21 & 0x1f);
            uVar29 = (ulong)(iVar33 + (uint)(bVar38 ^ 1));
            if (bVar38 != false) {
              uVar9 = 0;
            }
            uVar23 = uVar23 | uVar9;
          }
          if (uVar23 != 0) {
            if ((int)uVar23 < 1) {
              __assert_fail("Supp > 0",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                            ,0x575,"int Abc_TtSuppIsMinBase(int)");
            }
            if ((uVar23 + 1 & uVar23) != 0) {
              if ((int)uVar22 < 7) {
                uVar34 = 1;
              }
              iVar8 = 0;
              for (uVar28 = 0; uVar28 != uVar35; uVar28 = uVar28 + 1) {
                if ((uVar23 >> ((uint)uVar28 & 0x1f) & 1) != 0) {
                  uVar30 = uVar28;
                  while ((long)iVar8 < (long)uVar30) {
                    uVar1 = uVar30 - 1;
                    if ((long)uVar30 < 6) {
                      uVar27 = s_PMasks[uVar1][0];
                      uVar4 = s_PMasks[uVar1][1];
                      uVar5 = s_PMasks[uVar1][2];
                      for (uVar32 = 0; uVar30 = uVar1, uVar34 != uVar32; uVar32 = uVar32 + 1) {
                        uVar30 = pwVar14[uVar32];
                        bVar21 = (byte)(1 << ((byte)uVar1 & 0x1f));
                        pwVar14[uVar32] =
                             (uVar30 & uVar5) >> (bVar21 & 0x3f) |
                             (uVar30 & uVar4) << (bVar21 & 0x3f) | uVar30 & uVar27;
                      }
                    }
                    else {
                      pwVar15 = pwVar14;
                      if (uVar1 == 5) {
                        for (; uVar30 = uVar1, pwVar15 < pwVar14 + uVar34; pwVar15 = pwVar15 + 2) {
                          *(ulong *)((long)pwVar15 + 4) =
                               CONCAT44((int)*(undefined8 *)((long)pwVar15 + 4),
                                        (int)((ulong)*(undefined8 *)((long)pwVar15 + 4) >> 0x20));
                        }
                      }
                      else {
                        uVar22 = 1 << ((char)uVar30 - 7U & 0x1f);
                        if (uVar30 < 8) {
                          uVar22 = 1;
                        }
                        iVar24 = uVar22 * 4;
                        uVar27 = 0;
                        if (0 < (int)uVar22) {
                          uVar27 = (ulong)uVar22;
                        }
                        pwVar31 = pwVar14 + (int)(uVar22 * 2);
                        pwVar25 = pwVar14 + (int)uVar22;
                        for (; uVar30 = uVar1, pwVar15 < pwVar14 + uVar34;
                            pwVar15 = pwVar15 + iVar24) {
                          for (uVar30 = 0; uVar27 != uVar30; uVar30 = uVar30 + 1) {
                            wVar6 = pwVar25[uVar30];
                            pwVar25[uVar30] = pwVar31[uVar30];
                            pwVar31[uVar30] = wVar6;
                          }
                          pwVar31 = pwVar31 + iVar24;
                          pwVar25 = pwVar25 + iVar24;
                        }
                      }
                    }
                  }
                  iVar8 = iVar8 + 1;
                }
              }
              if (iVar8 != iVar33) {
                __assert_fail("Var == nVars",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/util/utilTruth.h"
                              ,0x6e7,"void Abc_TtShrink(word *, int, int, unsigned int)");
              }
            }
          }
          if (iVar33 == 1) {
            iVar33 = local_198;
            if (local_198 == -1) {
              iVar33 = p_00->nSize;
              Vec_WecPushLevel(p_00);
              local_198 = iVar33;
            }
          }
          else {
            if (iVar33 != 0) {
              Abc_TtCanonicize(pwVar14,iVar33,pCanonPerm);
              pVVar12 = vTtMem[uVar29];
              iVar33 = pVVar12->nEntries;
              pVVar13 = pVVar12->vTable;
              iVar8 = pVVar13->nSize;
              if (iVar8 < iVar33) {
                iVar8 = Abc_PrimeCudd(iVar8 * 2);
                Vec_IntFill(pVVar13,iVar8,-1);
                pVVar12->vNexts->nSize = 0;
                for (iVar8 = 0; iVar24 = pVVar12->nEntries, iVar8 < iVar24; iVar8 = iVar8 + 1) {
                  pwVar15 = Vec_MemReadEntry(pVVar12,iVar8);
                  if (pwVar15 == (word *)0x0) {
                    iVar24 = pVVar12->nEntries;
                    break;
                  }
                  piVar16 = Vec_MemHashLookup(pVVar12,pwVar15);
                  if (*piVar16 != -1) {
                    __assert_fail("*pSpot == -1",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                                  ,0x16f,"void Vec_MemHashResize(Vec_Mem_t *)");
                  }
                  pVVar13 = pVVar12->vNexts;
                  *piVar16 = pVVar13->nSize;
                  Vec_IntPush(pVVar13,-1);
                }
                if (iVar24 != pVVar12->vNexts->nSize) {
                  __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                                ,0x173,"void Vec_MemHashResize(Vec_Mem_t *)");
                }
              }
              piVar16 = Vec_MemHashLookup(pVVar12,pwVar14);
              iVar8 = *piVar16;
              if (iVar8 == -1) {
                pVVar13 = pVVar12->vNexts;
                *piVar16 = pVVar13->nSize;
                Vec_IntPush(pVVar13,-1);
                uVar22 = pVVar12->nEntries;
                if ((int)uVar22 < 0) {
                  __assert_fail("i >= 0",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                                ,0xd8,"word *Vec_MemGetEntry(Vec_Mem_t *, int)");
                }
                uVar23 = uVar22 >> ((byte)pVVar12->LogPageSze & 0x1f);
                iVar8 = pVVar12->iPage;
                if (iVar8 < (int)uVar23) {
                  iVar24 = pVVar12->nPageAlloc;
                  if (iVar24 <= (int)uVar23) {
                    iVar26 = uVar23 + 0x20;
                    if (iVar24 != 0) {
                      iVar26 = iVar24 * 2;
                    }
                    pVVar12->nPageAlloc = iVar26;
                    if (pVVar12->ppPages == (word **)0x0) {
                      ppwVar17 = (word **)malloc((long)iVar26 * 8);
                    }
                    else {
                      ppwVar17 = (word **)realloc(pVVar12->ppPages,(long)iVar26 * 8);
                      iVar8 = pVVar12->iPage;
                    }
                    pVVar12->ppPages = ppwVar17;
                  }
                  for (lVar36 = (long)iVar8; lVar36 < (long)(ulong)uVar23; lVar36 = lVar36 + 1) {
                    pwVar15 = (word *)malloc((long)(pVVar12->nEntrySize <<
                                                   ((byte)pVVar12->LogPageSze & 0x1f)) << 3);
                    pVVar12->ppPages[lVar36 + 1] = pwVar15;
                  }
                  pVVar12->iPage = uVar23;
                }
                pVVar12->nEntries = uVar22 + 1;
                pwVar15 = Vec_MemReadEntry(pVVar12,uVar22);
                memmove(pwVar15,pwVar14,(long)pVVar12->nEntrySize << 3);
                iVar24 = pVVar12->nEntries;
                if (iVar24 != pVVar12->vNexts->nSize) {
                  __assert_fail("p->nEntries == Vec_IntSize(p->vNexts)",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecMem.h"
                                ,0x180,"int Vec_MemHashInsert(Vec_Mem_t *, word *)");
                }
                iVar8 = iVar24 + -1;
              }
              else {
                iVar24 = pVVar12->nEntries;
              }
              pVVar13 = vTt2Class[uVar29];
              if (iVar33 != iVar24) {
                iVar33 = Vec_IntEntry(pVVar13,iVar8);
                if (iVar33 != -1) {
                  __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) == -1",
                                "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                                ,0x313,
                                "Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
                }
                Vec_IntWriteEntry(pVVar13,iVar8,p_00->nSize);
                Vec_WecPushLevel(p_00);
              }
              iVar33 = Vec_IntEntry(pVVar13,iVar8);
              if (iVar33 < 0) {
                __assert_fail("Vec_IntEntry(vTt2Class[nVars], truthId) >= 0",
                              "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/aig/gia/giaTruth.c"
                              ,0x317,
                              "Gia_Man_t *Gia_ManIsoNpnReduce(Gia_Man_t *, Vec_Ptr_t **, int)");
              }
              iVar33 = Vec_IntEntry(pVVar13,iVar8);
              goto LAB_00210838;
            }
            iVar33 = local_194;
            if (local_194 == -1) {
              iVar33 = p_00->nSize;
              Vec_WecPushLevel(p_00);
              local_194 = iVar33;
            }
          }
          Vec_WecPush(p_00,iVar33,iVar7);
          goto LAB_00210843;
        }
        iVar33 = local_198;
        if (local_198 == -1) {
          iVar33 = p_00->nSize;
          Vec_WecPushLevel(p_00);
          local_198 = iVar33;
        }
      }
LAB_00210838:
      Vec_WecPush(p_00,iVar33,iVar7);
    }
    else {
      pVVar13 = Vec_WecPushLevel(p_00);
      Vec_IntPush(pVVar13,iVar7);
    }
LAB_00210843:
    iVar7 = iVar7 + 1;
  } while( true );
}

Assistant:

Gia_Man_t * Gia_ManIsoNpnReduce( Gia_Man_t * p, Vec_Ptr_t ** pvPosEquivs, int fVerbose )
{
    char pCanonPerm[16];
    int i, iObj, uCanonPhase, nVars, lastId, truthId;
    int IndexCon = -1, IndexVar = -1;
    Vec_Wec_t * vPosEquivs = Vec_WecAlloc( 100 );
    word * pTruth;
    Gia_Obj_t * pObj;
    Vec_Mem_t * vTtMem[17];   // truth table memory and hash table
    Gia_Man_t * pNew = NULL;
    Vec_Int_t * vLeaves = Vec_IntAlloc( 16 );
    Vec_Int_t * vFirsts;
    Vec_Int_t * vTt2Class[17];
    for ( i = 0; i < 17; i++ )
    {
        vTtMem[i] = Vec_MemAlloc( Abc_TtWordNum(i), 10 );
        Vec_MemHashAlloc( vTtMem[i], 1000 );
        vTt2Class[i] = Vec_IntStartFull( Gia_ManCoNum(p)+1 );
    }
    Gia_ObjComputeTruthTableStart( p, 16 );
    Gia_ManForEachPo( p, pObj, i )
    {
        iObj = Gia_ObjId(p, pObj);
        Gia_ManCollectCis( p, &iObj, 1, vLeaves );
        if ( Vec_IntSize(vLeaves) > 16 )
        {
            Vec_IntPush( Vec_WecPushLevel(vPosEquivs), i );
            continue;
        }
        pObj = Gia_ObjFanin0(pObj);
        if ( Gia_ObjIsConst0(pObj) )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( Gia_ObjIsCi(pObj) )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        assert( Gia_ObjIsAnd(pObj) );
        pTruth = Gia_ObjComputeTruthTableCut( p, pObj, vLeaves );
        Abc_TtMinimumBase( pTruth, NULL, Vec_IntSize(vLeaves), &nVars );
        if ( nVars == 0 )
        {
            if ( IndexCon == -1 )
            {
                IndexCon = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexCon, i );
            continue;
        }
        if ( nVars == 1 )
        {
            if ( IndexVar == -1 )
            {
                IndexVar = Vec_WecSize(vPosEquivs);
                Vec_WecPushLevel(vPosEquivs);
            }
            Vec_WecPush( vPosEquivs, IndexVar, i );
            continue;
        }
        uCanonPhase = Abc_TtCanonicize( pTruth, nVars, pCanonPerm );
        lastId = Vec_MemEntryNum( vTtMem[nVars] );
        truthId = Vec_MemHashInsert( vTtMem[nVars], pTruth );
        if ( lastId != Vec_MemEntryNum( vTtMem[nVars] ) ) // new one
        {
            assert( Vec_IntEntry(vTt2Class[nVars], truthId) == -1 );
            Vec_IntWriteEntry( vTt2Class[nVars], truthId, Vec_WecSize(vPosEquivs) );
            Vec_WecPushLevel(vPosEquivs);
        }
        assert( Vec_IntEntry(vTt2Class[nVars], truthId) >= 0 );
        Vec_WecPush( vPosEquivs, Vec_IntEntry(vTt2Class[nVars], truthId), i );
    }
    Gia_ObjComputeTruthTableStop( p );
    Vec_IntFree( vLeaves );
    for ( i = 0; i < 17; i++ )
    {
        Vec_MemHashFree( vTtMem[i] );
        Vec_MemFree( vTtMem[i] );
        Vec_IntFree( vTt2Class[i] );
    }

    // find the first outputs and derive GIA
    vFirsts = Vec_WecCollectFirsts( vPosEquivs );
    pNew = Gia_ManDupCones( p, Vec_IntArray(vFirsts), Vec_IntSize(vFirsts), 0 );
    Vec_IntFree( vFirsts );
    // report and return    
    if ( fVerbose )
    { 
        printf( "Nontrivial classes:\n" );
        Vec_WecPrint( vPosEquivs, 1 );
    }
    if ( pvPosEquivs )
        *pvPosEquivs = Vec_WecConvertToVecPtr( vPosEquivs );
    Vec_WecFree( vPosEquivs );
    return pNew;
}